

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O2

void __thiscall
ScriptBuilder_ScriptStackByOperator_Test::TestBody(ScriptBuilder_ScriptStackByOperator_Test *this)

{
  char *message;
  AssertHelper local_110;
  AssertionResult gtest_ar;
  string local_f8;
  ScriptBuilder build1;
  Script script1;
  Script script;
  ScriptBuilder builder;
  string exp_hex;
  
  std::__cxx11::string::string
            ((string *)&exp_hex,
             "4c6a47304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01210229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551"
             ,(allocator *)&script1);
  build1._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_005ba258;
  build1.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  build1.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  build1.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&script1,
             "304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01"
             ,(allocator *)&builder);
  cfd::core::ByteData::ByteData((ByteData *)&script,(string *)&script1);
  cfd::core::ScriptBuilder::operator<<(&build1,(ByteData *)&script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
  std::__cxx11::string::~string((string *)&script1);
  std::__cxx11::string::string
            ((string *)&script1,"0229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551"
             ,(allocator *)&builder);
  cfd::core::Pubkey::Pubkey((Pubkey *)&script,(string *)&script1);
  cfd::core::ScriptBuilder::operator<<(&build1,(Pubkey *)&script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
  std::__cxx11::string::~string((string *)&script1);
  cfd::core::ScriptBuilder::Build(&script1,&build1);
  builder._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_005ba258;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::ScriptBuilder::operator<<(&builder,&script1);
  cfd::core::ScriptBuilder::Build(&script,&builder);
  cfd::core::Script::GetHex_abi_cxx11_(&local_f8,&script);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"exp_hex","script.GetHex()",&exp_hex,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x14f,message);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Script::~Script(&script);
  cfd::core::ScriptBuilder::~ScriptBuilder(&builder);
  cfd::core::Script::~Script(&script1);
  cfd::core::ScriptBuilder::~ScriptBuilder(&build1);
  std::__cxx11::string::~string((string *)&exp_hex);
  return;
}

Assistant:

TEST(ScriptBuilder, ScriptStackByOperator) {
  std::string exp_hex = "4c6a47304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01210229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551";

  ScriptBuilder build1;
  build1 << ByteData("304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01");
  build1 << Pubkey("0229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551");
  auto script1 = build1.Build();

  ScriptBuilder builder;
  builder << script1;
  auto script = builder.Build();
  EXPECT_EQ(exp_hex, script.GetHex());
}